

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

tuple<mjs::token_type,_int> mjs::anon_unknown_2::get_punctuation(wstring_view s,version v)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  runtime_error *this;
  int in_ECX;
  undefined4 in_register_00000014;
  _Tuple_impl<0UL,_mjs::token_type,_int> this_00;
  size_type local_558;
  string local_538 [39];
  allocator<char> local_511;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_510;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_508;
  string local_500 [48];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_4d0;
  undefined1 local_4c0 [8];
  wstring qs;
  ostringstream oss;
  int local_324 [2];
  pair<mjs::token_type,_int> local_31c;
  int local_314 [2];
  pair<mjs::token_type,_int> local_30c;
  int local_304 [2];
  pair<mjs::token_type,_int> local_2fc;
  int local_2f4 [2];
  pair<mjs::token_type,_int> local_2ec;
  int local_2e4 [2];
  pair<mjs::token_type,_int> local_2dc;
  int local_2d4 [2];
  pair<mjs::token_type,_int> local_2cc;
  int local_2c4 [2];
  pair<mjs::token_type,_int> local_2bc;
  int local_2b4 [2];
  pair<mjs::token_type,_int> local_2ac;
  int local_2a4 [2];
  pair<mjs::token_type,_int> local_29c;
  int local_294 [2];
  pair<mjs::token_type,_int> local_28c;
  int local_284 [2];
  pair<mjs::token_type,_int> local_27c;
  int local_274 [2];
  pair<mjs::token_type,_int> local_26c;
  int local_264 [2];
  pair<mjs::token_type,_int> local_25c;
  int local_254 [2];
  pair<mjs::token_type,_int> local_24c;
  int local_244 [2];
  pair<mjs::token_type,_int> local_23c;
  int local_234 [2];
  pair<mjs::token_type,_int> local_22c;
  int local_224 [2];
  pair<mjs::token_type,_int> local_21c;
  int local_214 [2];
  pair<mjs::token_type,_int> local_20c;
  int local_204 [2];
  pair<mjs::token_type,_int> local_1fc;
  int local_1f4 [2];
  pair<mjs::token_type,_int> local_1ec;
  int local_1e4 [2];
  pair<mjs::token_type,_int> local_1dc;
  int local_1d4 [2];
  pair<mjs::token_type,_int> local_1cc;
  int local_1c4 [2];
  pair<mjs::token_type,_int> local_1bc;
  int local_1b4 [2];
  pair<mjs::token_type,_int> local_1ac;
  int local_1a4 [2];
  pair<mjs::token_type,_int> local_19c;
  int local_194 [2];
  pair<mjs::token_type,_int> local_18c;
  int local_184 [2];
  pair<mjs::token_type,_int> local_17c;
  int local_174 [2];
  pair<mjs::token_type,_int> local_16c;
  int local_164 [2];
  pair<mjs::token_type,_int> local_15c;
  int local_154 [2];
  pair<mjs::token_type,_int> local_14c;
  int local_144 [2];
  pair<mjs::token_type,_int> local_13c;
  int local_134 [2];
  pair<mjs::token_type,_int> local_12c;
  int local_124 [2];
  pair<mjs::token_type,_int> local_11c;
  int local_114 [2];
  pair<mjs::token_type,_int> local_10c;
  int local_104 [2];
  pair<mjs::token_type,_int> local_fc;
  int local_f4 [2];
  pair<mjs::token_type,_int> local_ec;
  int local_e4 [2];
  pair<mjs::token_type,_int> local_dc;
  int local_d4 [2];
  pair<mjs::token_type,_int> local_cc;
  int local_c4 [2];
  pair<mjs::token_type,_int> local_bc;
  int local_b4 [2];
  pair<mjs::token_type,_int> local_ac;
  int local_a4 [2];
  pair<mjs::token_type,_int> local_9c;
  int local_94 [2];
  pair<mjs::token_type,_int> local_8c;
  int local_84 [2];
  pair<mjs::token_type,_int> local_7c;
  int local_74 [2];
  pair<mjs::token_type,_int> local_6c;
  int local_64 [2];
  pair<mjs::token_type,_int> local_5c;
  int local_54 [2];
  pair<mjs::token_type,_int> local_4c;
  int local_44 [2];
  pair<mjs::token_type,_int> local_3c;
  int local_34 [2];
  pair<mjs::token_type,_int> local_2c;
  int local_24;
  undefined1 auStack_20 [4];
  version v_local;
  wstring_view s_local;
  
  s_local._M_len = CONCAT44(in_register_00000014,v);
  _auStack_20 = s._M_str;
  this_00 = (_Tuple_impl<0UL,_mjs::token_type,_int>)s._M_len;
  local_24 = in_ECX;
  s_local._M_str = (wchar_t *)this_00;
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!s.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x7c,
                  "std::tuple<token_type, int> mjs::(anonymous namespace)::get_punctuation(std::wstring_view, version)"
                 );
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      3 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,4,
                         L">>>="), iVar2 == 0)) {
    local_34[1] = 5;
    local_34[0] = 4;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2c,(token_type *)(local_34 + 1),local_34);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      2 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,3,
                         L">>>"), iVar2 == 0)) {
    local_44[1] = 6;
    local_44[0] = 3;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_3c,(token_type *)(local_44 + 1),local_44);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_3c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      2 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,3,
                         L"<<="), iVar2 == 0)) {
    local_54[1] = 7;
    local_54[0] = 3;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_4c,(token_type *)(local_54 + 1),local_54);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_4c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      2 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,3,
                         L">>="), iVar2 == 0)) {
    local_64[1] = 8;
    local_64[0] = 3;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_5c,(token_type *)(local_64 + 1),local_64);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_5c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((0 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      2 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,3,
                         L"==="), iVar2 == 0)) {
    local_74[1] = 9;
    local_74[0] = 3;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_6c,(token_type *)(local_74 + 1),local_74);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_6c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((0 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      2 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,3,
                         L"!=="), iVar2 == 0)) {
    local_84[1] = 10;
    local_84[0] = 3;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_7c,(token_type *)(local_84 + 1),local_84);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_7c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"=="), iVar2 == 0)) {
    local_94[1] = 0xb;
    local_94[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_8c,(token_type *)(local_94 + 1),local_94);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_8c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"!="), iVar2 == 0)) {
    local_a4[1] = 0xc;
    local_a4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_9c,(token_type *)(local_a4 + 1),local_a4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_9c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"<="), iVar2 == 0)) {
    local_b4[1] = 0xd;
    local_b4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_ac,(token_type *)(local_b4 + 1),local_b4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_ac);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L">="), iVar2 == 0)) {
    local_c4[1] = 0xe;
    local_c4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_bc,(token_type *)(local_c4 + 1),local_c4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_bc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"&&"), iVar2 == 0)) {
    local_d4[1] = 0xf;
    local_d4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_cc,(token_type *)(local_d4 + 1),local_d4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_cc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"||"), iVar2 == 0)) {
    local_e4[1] = 0x10;
    local_e4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_dc,(token_type *)(local_e4 + 1),local_e4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_dc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"++"), iVar2 == 0)) {
    local_f4[1] = 0x11;
    local_f4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_ec,(token_type *)(local_f4 + 1),local_f4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_ec);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"--"), iVar2 == 0)) {
    local_104[1] = 0x12;
    local_104[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_fc,(token_type *)(local_104 + 1),local_104);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_fc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"<<"), iVar2 == 0)) {
    local_114[1] = 0x13;
    local_114[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_10c,(token_type *)(local_114 + 1),local_114);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_10c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L">>"), iVar2 == 0)) {
    local_124[1] = 0x14;
    local_124[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_11c,(token_type *)(local_124 + 1),local_124);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_11c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"+="), iVar2 == 0)) {
    local_134[1] = 0x15;
    local_134[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_12c,(token_type *)(local_134 + 1),local_134);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_12c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"-="), iVar2 == 0)) {
    local_144[1] = 0x16;
    local_144[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_13c,(token_type *)(local_144 + 1),local_144);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_13c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"*="), iVar2 == 0)) {
    local_154[1] = 0x17;
    local_154[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_14c,(token_type *)(local_154 + 1),local_154);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_14c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"/="), iVar2 == 0)) {
    local_164[1] = 0x18;
    local_164[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_15c,(token_type *)(local_164 + 1),local_164);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_15c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"&="), iVar2 == 0)) {
    local_174[1] = 0x19;
    local_174[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_16c,(token_type *)(local_174 + 1),local_174);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_16c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"|="), iVar2 == 0)) {
    local_184[1] = 0x1a;
    local_184[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_17c,(token_type *)(local_184 + 1),local_184);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_17c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"^="), iVar2 == 0)) {
    local_194[1] = 0x1b;
    local_194[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_18c,(token_type *)(local_194 + 1),local_194);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_18c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      1 < sVar3)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,2,
                         L"%="), iVar2 == 0)) {
    local_1a4[1] = 0x1c;
    local_1a4[0] = 2;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_19c,(token_type *)(local_1a4 + 1),local_1a4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_19c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"="), iVar2 == 0)) {
    local_1b4[1] = 0x1d;
    local_1b4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1ac,(token_type *)(local_1b4 + 1),local_1b4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1ac);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L">"), iVar2 == 0)) {
    local_1c4[1] = 0x1e;
    local_1c4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1bc,(token_type *)(local_1c4 + 1),local_1c4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1bc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"<"), iVar2 == 0)) {
    local_1d4[1] = 0x1f;
    local_1d4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1cc,(token_type *)(local_1d4 + 1),local_1d4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1cc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L","), iVar2 == 0)) {
    local_1e4[1] = 0x20;
    local_1e4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1dc,(token_type *)(local_1e4 + 1),local_1e4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1dc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"!"), iVar2 == 0)) {
    local_1f4[1] = 0x21;
    local_1f4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1ec,(token_type *)(local_1f4 + 1),local_1f4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1ec);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"~"), iVar2 == 0)) {
    local_204[1] = 0x22;
    local_204[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_1fc,(token_type *)(local_204 + 1),local_204);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_1fc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"?"), iVar2 == 0)) {
    local_214[1] = 0x23;
    local_214[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_20c,(token_type *)(local_214 + 1),local_214);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_20c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L":"), iVar2 == 0)) {
    local_224[1] = 0x24;
    local_224[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_21c,(token_type *)(local_224 + 1),local_224);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_21c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"."), iVar2 == 0)) {
    local_234[1] = 0x25;
    local_234[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_22c,(token_type *)(local_234 + 1),local_234);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_22c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"+"), iVar2 == 0)) {
    local_244[1] = 0x26;
    local_244[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_23c,(token_type *)(local_244 + 1),local_244);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_23c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"-"), iVar2 == 0)) {
    local_254[1] = 0x27;
    local_254[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_24c,(token_type *)(local_254 + 1),local_254);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_24c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"*"), iVar2 == 0)) {
    local_264[1] = 0x28;
    local_264[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_25c,(token_type *)(local_264 + 1),local_264);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_25c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"/"), iVar2 == 0)) {
    local_274[1] = 0x29;
    local_274[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_26c,(token_type *)(local_274 + 1),local_274);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_26c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"&"), iVar2 == 0)) {
    local_284[1] = 0x2a;
    local_284[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_27c,(token_type *)(local_284 + 1),local_284);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_27c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"|"), iVar2 == 0)) {
    local_294[1] = 0x2b;
    local_294[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_28c,(token_type *)(local_294 + 1),local_294);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_28c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"^"), iVar2 == 0)) {
    local_2a4[1] = 0x2c;
    local_2a4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_29c,(token_type *)(local_2a4 + 1),local_2a4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_29c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"%"), iVar2 == 0)) {
    local_2b4[1] = 0x2d;
    local_2b4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2ac,(token_type *)(local_2b4 + 1),local_2b4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2ac);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"("), iVar2 == 0)) {
    local_2c4[1] = 0x2e;
    local_2c4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2bc,(token_type *)(local_2c4 + 1),local_2c4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2bc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L")"), iVar2 == 0)) {
    local_2d4[1] = 0x2f;
    local_2d4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2cc,(token_type *)(local_2d4 + 1),local_2d4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2cc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"{"), iVar2 == 0)) {
    local_2e4[1] = 0x30;
    local_2e4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2dc,(token_type *)(local_2e4 + 1),local_2e4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2dc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"}"), iVar2 == 0)) {
    local_2f4[1] = 0x31;
    local_2f4[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2ec,(token_type *)(local_2f4 + 1),local_2f4);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2ec);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"["), iVar2 == 0)) {
    local_304[1] = 0x32;
    local_304[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_2fc,(token_type *)(local_304 + 1),local_304);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_2fc);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L"]"), iVar2 == 0)) {
    local_314[1] = 0x33;
    local_314[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_30c,(token_type *)(local_314 + 1),local_314);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_30c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  if (((-1 < local_24) &&
      (sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20),
      sVar3 != 0)) &&
     (iVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,1,
                         L";"), iVar2 == 0)) {
    local_324[1] = 0x34;
    local_324[0] = 1;
    std::pair<mjs::token_type,_int>::pair<mjs::token_type,_int,_true>
              (&local_31c,(token_type *)(local_324 + 1),local_324);
    std::tuple<mjs::token_type,_int>::tuple<mjs::token_type,_int,_true>
              ((tuple<mjs::token_type,_int> *)this_00,&local_31c);
    return (tuple<mjs::token_type,_int>)this_00;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)((long)&qs.field_2 + 8));
  sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20);
  if (sVar3 < 4) {
    local_558 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20);
  }
  else {
    local_558 = 4;
  }
  local_4d0 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20,0,
                         local_558);
  cpp_quote_abi_cxx11_((wstring *)local_4c0,(mjs *)&local_4d0,(wstring_view *)local_4d0._M_str);
  poVar4 = std::operator<<((ostream *)((long)&qs.field_2 + 8),"Unhandled character(s) in ");
  poVar4 = std::operator<<(poVar4,"get_punctuation");
  poVar4 = std::operator<<(poVar4,": ");
  local_508._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  local_510._M_current = (wchar_t *)std::__cxx11::wstring::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,void>
            (local_500,local_508,local_510,&local_511);
  poVar4 = std::operator<<(poVar4,local_500);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_511);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_538);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::tuple<token_type, int> get_punctuation(std::wstring_view s, version v) {
    assert(!s.empty());

#define CHECK_PUNCTUATORS(name, str, ver) if (v >= version::ver && s.length() >= sizeof(str)-1 && s.compare(0, sizeof(str)-1, L##str) == 0) return std::pair<token_type, int>{token_type::name, static_cast<int>(sizeof(str)-1)};
    MJS_PUNCTUATORS(CHECK_PUNCTUATORS)
#undef CHECK_PUNCTUATORS

        std::ostringstream oss;
    auto qs = cpp_quote(s.substr(0, s.length() < 4 ? s.length() : 4));
    oss << "Unhandled character(s) in " << __FUNCTION__ << ": " << std::string(qs.begin(), qs.end()) << "\n";
    throw std::runtime_error(oss.str());
}